

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

dat_t * rdr_readdat(rdr_t *rdr,FILE *file,_Bool lbl)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  dat_t *__ptr;
  seq_t **ppsVar4;
  seq_t *psVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  
  __ptr = (dat_t *)xmalloc(0x18);
  __ptr->mlen = 0;
  __ptr->nseq = 0;
  __ptr->lbl = lbl;
  ppsVar4 = (seq_t **)xmalloc(8000);
  __ptr->seq = ppsVar4;
  iVar3 = feof((FILE *)file);
  uVar7 = 1000;
  if (iVar3 == 0) {
    uVar8 = 1000;
    do {
      uVar7 = (uint)uVar8;
      psVar5 = rdr_readseq(rdr,file,lbl);
      if (psVar5 == (seq_t *)0x0) break;
      uVar6 = __ptr->nseq;
      ppsVar4 = __ptr->seq;
      if (uVar6 == uVar7) {
        uVar8 = (ulong)((double)(uVar8 & 0xffffffff) * 1.4);
        ppsVar4 = (seq_t **)xrealloc(ppsVar4,(uVar8 & 0xffffffff) << 3);
        __ptr->seq = ppsVar4;
        uVar6 = __ptr->nseq;
      }
      uVar7 = (uint)uVar8;
      uVar1 = uVar6 + 1;
      __ptr->nseq = uVar1;
      ppsVar4[uVar6] = psVar5;
      uVar2 = psVar5->len;
      if (psVar5->len < __ptr->mlen) {
        uVar2 = __ptr->mlen;
      }
      __ptr->mlen = uVar2;
      if ((uVar1 * 0x26e978d5 >> 3 | uVar1 * -0x60000000) < 0x418938) {
        info("%7u sequences loaded\n");
      }
      iVar3 = feof((FILE *)file);
    } while (iVar3 == 0);
  }
  uVar2 = __ptr->nseq;
  if ((ulong)uVar2 == 0) {
    free(__ptr->seq);
    free(__ptr);
    __ptr = (dat_t *)0x0;
  }
  else if (uVar2 < uVar7) {
    ppsVar4 = (seq_t **)xrealloc(__ptr->seq,(ulong)uVar2 << 3);
    __ptr->seq = ppsVar4;
  }
  return __ptr;
}

Assistant:

dat_t *rdr_readdat(rdr_t *rdr, FILE *file, bool lbl) {
	// Prepare dataset
	uint32_t size = 1000;
	dat_t *dat = xmalloc(sizeof(dat_t));
	dat->nseq = 0;
	dat->mlen = 0;
	dat->lbl = lbl;
	dat->seq = xmalloc(sizeof(seq_t *) * size);
	// Load sequences
	while (!feof(file)) {
		// Read the next sequence
		seq_t *seq = rdr_readseq(rdr, file, lbl);
		if (seq == NULL)
			break;
		// Grow the buffer if needed
		if (dat->nseq == size) {
			size *= 1.4;
			dat->seq = xrealloc(dat->seq, sizeof(seq_t *) * size);
		}
		// And store the sequence
		dat->seq[dat->nseq++] = seq;
		dat->mlen = max(dat->mlen, seq->len);
		if (dat->nseq % 1000 == 0)
			info("%7"PRIu32" sequences loaded\n", dat->nseq);
	}
	// If no sequence readed, cleanup and repport
	if (dat->nseq == 0) {
		free(dat->seq);
		free(dat);
		return NULL;
	}
	// Adjust the dataset size and return
	if (size > dat->nseq)
		dat->seq = xrealloc(dat->seq, sizeof(seq_t *) * dat->nseq);
	return dat;
}